

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O1

long __thiscall despot::Pocman::NextPos(Pocman *this,Coord *from,int dir)

{
  long lVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  Coord nextPos;
  undefined8 local_30;
  long local_28;
  long local_20;
  
  despot::Coord::Coord((Coord *)&local_30);
  if (((*(int *)from == 0) && (dir == 3)) && (iVar3 = *(int *)(from + 4), iVar3 == this->passage_y_)
     ) {
    iVar4 = (this->maze_).xsize_ + -1;
  }
  else {
    if (((*(int *)from != (this->maze_).xsize_ + -1) || (dir != 1)) ||
       (iVar3 = *(int *)(from + 4), iVar3 != this->passage_y_)) {
      local_20 = despot::operator+(from,(Coord *)(&Compass::DIRECTIONS + dir));
      goto LAB_00108fd3;
    }
    iVar4 = 0;
  }
  despot::Coord::Coord((Coord *)&local_20,iVar4,iVar3);
LAB_00108fd3:
  local_30._0_4_ = (int)local_20;
  lVar1 = local_20;
  if (((-1 < (int)local_30) &&
      (local_30._4_4_ = (int)((ulong)local_20 >> 0x20), lVar1 = local_20, -1 < local_20)) &&
     ((lVar1 = local_20, (int)local_30 < (this->maze_).xsize_ &&
      ((lVar1 = local_20, local_30._4_4_ < (this->maze_).ysize_ &&
       (local_30 = local_20, pbVar2 = (byte *)Grid<int>::operator()(&this->maze_,(Coord *)&local_30)
       , lVar1 = local_30, (*pbVar2 & 1) != 0)))))) {
    return local_30;
  }
  local_30 = lVar1;
  despot::Coord::Coord((Coord *)&local_28,-1,-1);
  return local_28;
}

Assistant:

Coord Pocman::NextPos(const Coord& from, int dir) const {
	Coord nextPos;
	if (from.x == 0 && from.y == passage_y_ && dir == Compass::WEST)
		nextPos = Coord(maze_.xsize() - 1, from.y);
	else if (from.x == maze_.xsize() - 1 && from.y == passage_y_
		&& dir == Compass::EAST)
		nextPos = Coord(0, from.y);
	else
		nextPos = from + Compass::DIRECTIONS[dir];

	if (maze_.Inside(nextPos) && Passable(nextPos))
		return nextPos;
	else
		return Coord(-1, -1);
}